

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::UnknownFieldSet::SerializeToCord(UnknownFieldSet *this,Cord *output)

{
  bool bVar1;
  size_t size_hint;
  undefined1 local_d0 [40];
  CodedOutputStream coded_output_stream;
  CordOutputStream cord_output_stream;
  size_t size;
  Cord *output_local;
  UnknownFieldSet *this_local;
  
  size_hint = internal::WireFormat::ComputeUnknownFieldsSize(this);
  io::CordOutputStream::CordOutputStream
            ((CordOutputStream *)&coded_output_stream.start_count_,size_hint);
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::CordOutputStream,void>
            ((CodedOutputStream *)(local_d0 + 0x20),
             (CordOutputStream *)&coded_output_stream.start_count_);
  bVar1 = SerializeToCodedStream(this,(CodedOutputStream *)(local_d0 + 0x20));
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  local_d0._17_3_ = 0;
  local_d0[0x10] = !bVar1;
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)(local_d0 + 0x20));
  if (local_d0._16_4_ == 0) {
    io::CordOutputStream::Consume((CordOutputStream *)local_d0);
    absl::lts_20250127::Cord::operator=(output,(Cord *)local_d0);
    absl::lts_20250127::Cord::~Cord((Cord *)local_d0);
    this_local._7_1_ = 1;
    local_d0._16_4_ = 1;
  }
  io::CordOutputStream::~CordOutputStream((CordOutputStream *)&coded_output_stream.start_count_);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool UnknownFieldSet::SerializeToCord(absl::Cord* output) const {
  const size_t size =
      google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(*this);
  io::CordOutputStream cord_output_stream(size);
  {
    io::CodedOutputStream coded_output_stream(&cord_output_stream);
    if (!SerializeToCodedStream(&coded_output_stream)) return false;
  }
  *output = cord_output_stream.Consume();
  return true;
}